

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtree.c
# Opt level: O0

_Bool ts_subtree_external_scanner_state_eq(Subtree self,Subtree other)

{
  _Bool _Var1;
  ExternalScannerState *local_28;
  ExternalScannerState *state2;
  ExternalScannerState *state1;
  Subtree other_local;
  Subtree self_local;
  
  state2 = &empty_state;
  local_28 = &empty_state;
  if (((self.ptr != (SubtreeHeapData *)0x0) && (_Var1 = ts_subtree_has_external_tokens(self), _Var1)
      ) && ((self.ptr)->child_count == 0)) {
    state2 = (ExternalScannerState *)&(self.ptr)->field_17;
  }
  if (((other.ptr != (SubtreeHeapData *)0x0) &&
      (_Var1 = ts_subtree_has_external_tokens(other), _Var1)) && ((other.ptr)->child_count == 0)) {
    local_28 = (ExternalScannerState *)&(other.ptr)->field_17;
  }
  _Var1 = ts_external_scanner_state_eq(state2,local_28);
  return _Var1;
}

Assistant:

bool ts_subtree_external_scanner_state_eq(Subtree self, Subtree other) {
  const ExternalScannerState *state1 = &empty_state;
  const ExternalScannerState *state2 = &empty_state;
  if (self.ptr && ts_subtree_has_external_tokens(self) && !self.ptr->child_count) {
    state1 = &self.ptr->external_scanner_state;
  }
  if (other.ptr && ts_subtree_has_external_tokens(other) && !other.ptr->child_count) {
    state2 = &other.ptr->external_scanner_state;
  }
  return ts_external_scanner_state_eq(state1, state2);
}